

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O1

SUNErrCode N_VDotProdMulti(int nvec,N_Vector x,N_Vector *Y,sunrealtype *dotprods)

{
  _func_SUNErrCode_int_N_Vector_N_Vector_ptr_sunrealtype_ptr *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  ulong uVar2;
  sunrealtype sVar3;
  
  UNRECOVERED_JUMPTABLE = x->ops->nvdotprodmulti;
  if (UNRECOVERED_JUMPTABLE != (_func_SUNErrCode_int_N_Vector_N_Vector_ptr_sunrealtype_ptr *)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,x,Y,dotprods);
    return SVar1;
  }
  if (0 < nvec) {
    uVar2 = 0;
    do {
      sVar3 = (*x->ops->nvdotprod)(x,Y[uVar2]);
      dotprods[uVar2] = sVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)nvec != uVar2);
  }
  return 0;
}

Assistant:

SUNErrCode N_VDotProdMulti(int nvec, N_Vector x, N_Vector* Y,
                           sunrealtype* dotprods)
{
  int i;
  SUNErrCode ier;

  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(x));

  if (x->ops->nvdotprodmulti != NULL)
  {
    ier = x->ops->nvdotprodmulti(nvec, x, Y, dotprods);
  }
  else
  {
    for (i = 0; i < nvec; i++) { dotprods[i] = x->ops->nvdotprod(x, Y[i]); }
    ier = SUN_SUCCESS;
  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(x));
  return (ier);
}